

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmTruth.c
# Opt level: O1

int Mpm_CutComputeTruth(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                       Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  ulong *puVar1;
  Vec_Mem_t *pVVar2;
  int v;
  long lVar3;
  byte bVar4;
  ulong *puVar5;
  word *pwVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Mpm_Cut_t *pMVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong *puVar14;
  uint uVar15;
  word *pwVar16;
  ulong uVar17;
  word *pwVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  word *tLimit;
  word t1;
  word t0;
  word tC;
  word local_68;
  Mpm_Cut_t *local_60;
  ulong *local_58;
  ulong local_50;
  ulong local_48;
  word local_40;
  ulong local_38;
  
  uVar11 = *(uint *)&pCut0->field_0x4;
  uVar7 = uVar11 >> 1 & 0xffffff;
  pVVar2 = p->vTtMem;
  iVar8 = pVVar2->nEntries;
  local_58 = (ulong *)CONCAT44(local_58._4_4_,p->nLutSize);
  local_60 = pCutC;
  if (p->nLutSize < 7) {
    if (iVar8 <= (int)uVar7) {
LAB_003f9091:
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    uVar22 = *(uint *)&pCut1->field_0x4;
    uVar15 = uVar22 >> 1 & 0xffffff;
    if (iVar8 <= (int)uVar15) goto LAB_003f9091;
    bVar4 = (byte)pVVar2->LogPageSze;
    local_48 = -(ulong)((uVar11 >> 0x19 & 1 ^ fCompl0) != (uVar11 & 1)) ^
               pVVar2->ppPages[uVar7 >> (bVar4 & 0x1f)]
               [(int)((uVar7 & pVVar2->PageMask) * pVVar2->nEntrySize)];
    local_50 = -(ulong)((uVar22 >> 0x19 & 1 ^ fCompl1) != (uVar22 & 1)) ^
               pVVar2->ppPages[uVar15 >> (bVar4 & 0x1f)]
               [(int)((uVar15 & pVVar2->PageMask) * pVVar2->nEntrySize)];
    local_40 = 0;
    local_68 = 0;
    if (0x7ffffff < uVar11 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
      uVar11 = (uVar11 >> 0x1b) - 1;
      uVar9 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
      do {
        uVar20 = uVar9 - 1;
        if (pCut->pLeaves[uVar9 - 1] <= pCut0->pLeaves[uVar11]) {
          if (pCut0->pLeaves[uVar11] != pCut->pLeaves[uVar9 - 1]) goto LAB_003f9072;
          if ((long)(int)uVar11 < (long)uVar20) {
            Abc_TtSwapVars(&local_48,(int)local_58,uVar11,(int)uVar20);
          }
          uVar11 = uVar11 - 1;
        }
      } while ((1 < (long)uVar9) && (uVar9 = uVar20, -1 < (int)uVar11));
    }
    pMVar10 = local_60;
    if (0x7ffffff < *(uint *)&pCut1->field_0x4 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
      iVar8 = p->nLutSize;
      uVar11 = (*(uint *)&pCut1->field_0x4 >> 0x1b) - 1;
      uVar9 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
      do {
        uVar20 = uVar9 - 1;
        if (pCut->pLeaves[uVar9 - 1] <= pCut1->pLeaves[uVar11]) {
          if (pCut1->pLeaves[uVar11] != pCut->pLeaves[uVar9 - 1]) goto LAB_003f9072;
          if ((long)(int)uVar11 < (long)uVar20) {
            Abc_TtSwapVars(&local_50,iVar8,uVar11,(int)uVar20);
          }
          uVar11 = uVar11 - 1;
        }
      } while ((1 < (long)uVar9) && (uVar9 = uVar20, -1 < (int)uVar11));
    }
    if (pMVar10 != (Mpm_Cut_t *)0x0) {
      uVar11 = *(uint *)&pMVar10->field_0x4;
      uVar7 = uVar11 >> 1 & 0xffffff;
      pVVar2 = p->vTtMem;
      if (pVVar2->nEntries <= (int)uVar7) goto LAB_003f9091;
      local_40 = -(ulong)((uVar11 >> 0x19 & 1 ^ fComplC) != (uVar11 & 1)) ^
                 pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)]
                 [(ulong)(pVVar2->PageMask & uVar7) * (long)pVVar2->nEntrySize];
      if (0x7ffffff < uVar11 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
        iVar8 = p->nLutSize;
        uVar11 = (uVar11 >> 0x1b) - 1;
        uVar9 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
        do {
          uVar20 = uVar9 - 1;
          if (pCut->pLeaves[uVar9 - 1] <= pMVar10->pLeaves[uVar11]) {
            if (pMVar10->pLeaves[uVar11] != pCut->pLeaves[uVar9 - 1]) {
LAB_003f9072:
              __assert_fail("pCut0->pLeaves[k] == pCut->pLeaves[i]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                            ,0x36,"void Mpm_TruthStretch(word *, Mpm_Cut_t *, Mpm_Cut_t *, int)");
            }
            if ((long)(int)uVar11 < (long)uVar20) {
              Abc_TtSwapVars(&local_40,iVar8,uVar11,(int)uVar20);
            }
            uVar11 = uVar11 - 1;
          }
        } while ((1 < (long)uVar9) && (uVar9 = uVar20, -1 < (int)uVar11));
      }
    }
    if (6 < p->nLutSize) {
      __assert_fail("p->nLutSize <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0xa1,
                    "int Mpm_CutComputeTruth6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                   );
    }
    if (Type == 3) {
      local_68 = (local_50 ^ local_48) & local_40 ^ local_48;
    }
    else if (Type == 2) {
      local_68 = local_50 ^ local_48;
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                      ,0xa8,
                      "int Mpm_CutComputeTruth6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      local_68 = local_50 & local_48;
    }
    if ((local_68 & 1) == 0) {
      uVar11 = Vec_MemHashInsert(p->vTtMem,&local_68);
      if ((int)uVar11 < 0) goto LAB_003f90b0;
      uVar11 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar11 & 0xffffff) * 2;
    }
    else {
      local_68 = ~local_68;
      uVar11 = Vec_MemHashInsert(p->vTtMem,&local_68);
      if ((int)uVar11 < 0) goto LAB_003f90b0;
      uVar11 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar11 & 0xffffff) * 2 + 1;
    }
    *(uint *)&pCut->field_0x4 = uVar11;
    if (p->pPars->fCutMin != 0) {
      uVar7 = uVar11 >> 1 & 0xffffff;
      pVVar2 = p->vTtMem;
      if (pVVar2->nEntries <= (int)uVar7) goto LAB_003f9091;
      local_38 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)]
                 [(ulong)(pVVar2->PageMask & uVar7) * (long)pVVar2->nEntrySize];
      if (0x37ffffff < uVar11) {
        __assert_fail("nVars <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x436,"int Abc_Tt6SupportAndSize(word, int, int *)");
      }
      uVar7 = 0;
      uVar22 = 0;
      if (0x7ffffff < uVar11) {
        pwVar16 = s_Truths6Neg;
        uVar7 = 0;
        uVar9 = 0;
        uVar22 = 0;
        do {
          uVar15 = 1 << ((byte)uVar9 & 0x1f);
          bVar23 = (*pwVar16 & (local_38 >> ((byte)uVar15 & 0x3f) ^ local_38)) != 0;
          if (!bVar23) {
            uVar15 = 0;
          }
          uVar7 = uVar7 + bVar23;
          uVar22 = uVar22 | uVar15;
          uVar9 = uVar9 + 1;
          pwVar16 = pwVar16 + 1;
        } while (uVar11 >> 0x1b != uVar9);
      }
      if (uVar7 == uVar11 >> 0x1b) {
        return 0;
      }
      p->nSmallSupp = p->nSmallSupp + (uint)((int)uVar7 < 2);
      uVar11 = *(uint *)&pCut->field_0x4;
      uVar15 = 0;
      if (0x7ffffff < uVar11) {
        uVar9 = 0;
        uVar15 = 0;
        do {
          if ((uVar22 >> ((uint)uVar9 & 0x1f) & 1) != 0) {
            if ((long)(int)uVar15 < (long)uVar9) {
              pCut->pLeaves[(int)uVar15] = pCut->pLeaves[uVar9];
              Abc_TtSwapVars(&local_38,p->nLutSize,uVar15,(uint)uVar9);
            }
            uVar15 = uVar15 + 1;
          }
          uVar9 = uVar9 + 1;
          uVar11 = *(uint *)&pCut->field_0x4;
        } while (uVar9 < uVar11 >> 0x1b);
      }
      if (uVar15 != uVar7) {
        __assert_fail("k == nSuppSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                      ,0x5f,"int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)");
      }
      *(uint *)&pCut->field_0x4 = uVar11 & 0x7ffffff | uVar7 << 0x1b;
      lVar3 = 0;
      pwVar16 = s_Truths6Neg;
      uVar11 = 0;
      do {
        uVar11 = (uVar11 + 1) -
                 (uint)(((local_38 >> ((byte)(1 << ((byte)lVar3 & 0x1f)) & 0x3f) ^ local_38) &
                        *pwVar16) == 0);
        lVar3 = lVar3 + 1;
        pwVar16 = pwVar16 + 1;
      } while (lVar3 != 6);
      if (uVar7 != uVar11) {
        __assert_fail("nSuppSize == Abc_TtSupportSize(&t, 6)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                      ,0x61,"int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)");
      }
      uVar11 = Vec_MemHashInsert(p->vTtMem,&local_38);
      if ((int)uVar11 < 0) {
LAB_003f90b0:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      *(uint *)&pCut->field_0x4 = (*(uint *)&pCut->field_0x4 & 0xfe000001) + (uVar11 & 0xffffff) * 2
      ;
    }
  }
  else {
    if (iVar8 <= (int)uVar7) goto LAB_003f9091;
    bVar4 = (byte)pVVar2->LogPageSze;
    uVar22 = *(uint *)&pCut1->field_0x4 >> 1 & 0xffffff;
    if (iVar8 <= (int)uVar22) goto LAB_003f9091;
    iVar8 = (uVar7 & pVVar2->PageMask) * pVVar2->nEntrySize;
    pwVar6 = pVVar2->ppPages[uVar7 >> (bVar4 & 0x1f)];
    iVar13 = (uVar22 & pVVar2->PageMask) * pVVar2->nEntrySize;
    pwVar18 = pVVar2->ppPages[uVar22 >> (bVar4 & 0x1f)];
    pwVar16 = p->Truth0;
    uVar7 = p->nTruWords;
    uVar9 = (ulong)uVar7;
    if ((uVar11 >> 0x19 & 1 ^ fCompl0) == (uVar11 & 1)) {
      if (0 < (int)uVar7) {
        uVar20 = 0;
        do {
          pwVar16[uVar20] = pwVar6[(long)iVar8 + uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar9 != uVar20);
      }
    }
    else if (0 < (int)uVar7) {
      uVar20 = 0;
      do {
        pwVar16[uVar20] = ~pwVar6[(long)iVar8 + uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar9 != uVar20);
    }
    pwVar6 = p->Truth1;
    if ((*(uint *)&pCut1->field_0x4 >> 0x19 & 1 ^ fCompl1) == (*(uint *)&pCut1->field_0x4 & 1)) {
      if (0 < (int)uVar7) {
        uVar20 = 0;
        do {
          pwVar6[uVar20] = pwVar18[(long)iVar13 + uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar9 != uVar20);
      }
    }
    else if (0 < (int)uVar7) {
      uVar20 = 0;
      do {
        pwVar6[uVar20] = ~pwVar18[(long)iVar13 + uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar9 != uVar20);
    }
    if (0x7ffffff < *(uint *)&pCut0->field_0x4 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
      uVar20 = (ulong)((*(uint *)&pCut0->field_0x4 >> 0x1b) - 1);
      uVar9 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
      do {
        uVar21 = uVar9 - 1;
        iVar8 = (int)uVar20;
        if (pCut->pLeaves[uVar9 - 1] <= pCut0->pLeaves[uVar20]) {
          if (pCut0->pLeaves[uVar20] != pCut->pLeaves[uVar9 - 1]) goto LAB_003f9072;
          if ((long)iVar8 < (long)uVar21) {
            Abc_TtSwapVars(pwVar16,(int)local_58,iVar8,(int)uVar21);
          }
          uVar20 = (ulong)(iVar8 - 1);
        }
      } while ((1 < (long)uVar9) && (uVar9 = uVar21, -1 < (int)uVar20));
    }
    pMVar10 = local_60;
    if (0x7ffffff < *(uint *)&pCut1->field_0x4 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
      iVar8 = p->nLutSize;
      uVar11 = (*(uint *)&pCut1->field_0x4 >> 0x1b) - 1;
      uVar9 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
      do {
        uVar20 = uVar9 - 1;
        if (pCut->pLeaves[uVar9 - 1] <= pCut1->pLeaves[uVar11]) {
          if (pCut1->pLeaves[uVar11] != pCut->pLeaves[uVar9 - 1]) goto LAB_003f9072;
          if ((long)(int)uVar11 < (long)uVar20) {
            Abc_TtSwapVars(pwVar6,iVar8,uVar11,(int)uVar20);
          }
          uVar11 = uVar11 - 1;
        }
      } while ((1 < (long)uVar9) && (uVar9 = uVar20, -1 < (int)uVar11));
    }
    if (pMVar10 != (Mpm_Cut_t *)0x0) {
      uVar11 = *(uint *)&pMVar10->field_0x4;
      uVar7 = uVar11 >> 1 & 0xffffff;
      pVVar2 = p->vTtMem;
      if (pVVar2->nEntries <= (int)uVar7) goto LAB_003f9091;
      iVar8 = (uVar7 & pVVar2->PageMask) * pVVar2->nEntrySize;
      pwVar6 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)];
      pwVar16 = p->TruthC;
      uVar7 = p->nTruWords;
      if ((uVar11 >> 0x19 & 1 ^ fComplC) == (uVar11 & 1)) {
        if (0 < (int)uVar7) {
          uVar9 = 0;
          do {
            pwVar16[uVar9] = pwVar6[(long)iVar8 + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
      }
      else if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          pwVar16[uVar9] = ~pwVar6[(long)iVar8 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      if (0x7ffffff < *(uint *)&pMVar10->field_0x4 && 0x7ffffff < *(uint *)&pCut->field_0x4) {
        iVar8 = p->nLutSize;
        uVar11 = (*(uint *)&pMVar10->field_0x4 >> 0x1b) - 1;
        uVar9 = (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
        do {
          uVar20 = uVar9 - 1;
          if (pCut->pLeaves[uVar9 - 1] <= pMVar10->pLeaves[uVar11]) {
            if (pMVar10->pLeaves[uVar11] != pCut->pLeaves[uVar9 - 1]) goto LAB_003f9072;
            if ((long)(int)uVar11 < (long)uVar20) {
              Abc_TtSwapVars(pwVar16,iVar8,uVar11,(int)uVar20);
            }
            uVar11 = uVar11 - 1;
          }
        } while ((1 < (long)uVar9) && (uVar9 = uVar20, -1 < (int)uVar11));
      }
    }
    if (Type == 3) {
      iVar8 = p->nTruWords;
      if (0 < (long)iVar8) {
        lVar3 = 0;
        do {
          p->Truth[lVar3] =
               (p->Truth1[lVar3] ^ p->Truth0[lVar3]) & p->TruthC[lVar3] ^ p->Truth0[lVar3];
          lVar3 = lVar3 + 1;
        } while (iVar8 != lVar3);
      }
    }
    else if (Type == 2) {
      iVar8 = p->nTruWords;
      if (0 < (long)iVar8) {
        lVar3 = 0;
        do {
          p->Truth[lVar3] = p->Truth1[lVar3] ^ p->Truth0[lVar3];
          lVar3 = lVar3 + 1;
        } while (iVar8 != lVar3);
      }
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                      ,0xca,
                      "int Mpm_CutComputeTruth7(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      iVar8 = p->nTruWords;
      if (0 < (long)iVar8) {
        lVar3 = 0;
        do {
          p->Truth[lVar3] = p->Truth1[lVar3] & p->Truth0[lVar3];
          lVar3 = lVar3 + 1;
        } while (iVar8 != lVar3);
      }
    }
    pwVar16 = p->Truth;
    if ((p->Truth[0] & 1) == 0) {
      uVar11 = Vec_MemHashInsert(p->vTtMem,pwVar16);
      if ((int)uVar11 < 0) goto LAB_003f90b0;
      uVar11 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar11 & 0xffffff) * 2;
    }
    else {
      iVar8 = p->nTruWords;
      if (0 < (long)iVar8) {
        lVar3 = 0;
        do {
          pwVar16[lVar3] = ~pwVar16[lVar3];
          lVar3 = lVar3 + 1;
        } while (iVar8 != lVar3);
      }
      uVar11 = Vec_MemHashInsert(p->vTtMem,pwVar16);
      if ((int)uVar11 < 0) goto LAB_003f90b0;
      uVar11 = (*(uint *)&pCut->field_0x4 & 0xfe000000) + (uVar11 & 0xffffff) * 2 + 1;
    }
    *(uint *)&pCut->field_0x4 = uVar11;
    if (p->pPars->fCutMin == 0) {
      return 1;
    }
    uVar7 = uVar11 >> 1 & 0xffffff;
    pVVar2 = p->vTtMem;
    if (pVVar2->nEntries <= (int)uVar7) goto LAB_003f9091;
    puVar1 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
             (int)((uVar7 & pVVar2->PageMask) * pVVar2->nEntrySize);
    local_60 = (Mpm_Cut_t *)(ulong)(uVar11 >> 0x1b);
    uVar22 = 0;
    uVar7 = 0;
    if (0x7ffffff < uVar11) {
      uVar9 = (ulong)(uint)(1 << ((byte)(uVar11 >> 0x1b) - 6 & 0x1f));
      local_58 = puVar1 + uVar9;
      uVar22 = 0;
      pMVar10 = (Mpm_Cut_t *)0x0;
      uVar7 = 0;
      do {
        bVar4 = (byte)pMVar10;
        if (uVar11 < 0x38000000) {
          if ((s_Truths6Neg[(long)pMVar10] &
              (*puVar1 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *puVar1)) != 0) {
LAB_003f8e5d:
            uVar7 = uVar7 | 1 << ((uint)pMVar10 & 0x1f);
            uVar22 = uVar22 + 1;
          }
        }
        else if ((Mpm_Cut_t *)&DAT_00000005 < pMVar10) {
          uVar20 = (ulong)(uint)(1 << (bVar4 - 6 & 0x1f));
          uVar15 = 2 << (bVar4 - 6 & 0x1f);
          puVar5 = puVar1 + uVar20;
          puVar14 = puVar1;
          do {
            uVar21 = 0;
            do {
              if (puVar14[uVar21] != puVar5[uVar21]) goto LAB_003f8e5d;
              uVar21 = uVar21 + 1;
            } while (uVar20 != uVar21);
            puVar14 = puVar14 + uVar15;
            puVar5 = puVar5 + uVar15;
          } while (puVar14 < local_58);
        }
        else {
          uVar20 = 0;
          do {
            if (((puVar1[uVar20] >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ puVar1[uVar20]) &
                s_Truths6Neg[(long)pMVar10]) != 0) goto LAB_003f8e5d;
            uVar20 = uVar20 + 1;
          } while (uVar9 != uVar20);
        }
        pMVar10 = (Mpm_Cut_t *)((long)&pMVar10->hNext + 1);
      } while (pMVar10 != local_60);
    }
    if (uVar22 == uVar11 >> 0x1b) {
      return 0;
    }
    p->nSmallSupp = p->nSmallSupp + (uint)((int)uVar22 < 2);
    iVar8 = p->nTruWords;
    if (0 < (long)iVar8) {
      lVar3 = 0;
      do {
        pwVar16[lVar3] = puVar1[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar8 != lVar3);
    }
    uVar11 = *(uint *)&pCut->field_0x4;
    if (uVar11 < 0x8000000) {
      uVar20 = (ulong)(uVar11 >> 0x1b);
      uVar15 = 0;
    }
    else {
      uVar9 = 0;
      uVar15 = 0;
      do {
        if ((uVar7 >> ((uint)uVar9 & 0x1f) & 1) != 0) {
          if ((long)(int)uVar15 < (long)uVar9) {
            pCut->pLeaves[(int)uVar15] = pCut->pLeaves[uVar9];
            Abc_TtSwapVars(pwVar16,p->nLutSize,uVar15,(uint)uVar9);
          }
          uVar15 = uVar15 + 1;
        }
        uVar9 = uVar9 + 1;
        uVar11 = *(uint *)&pCut->field_0x4;
        uVar20 = (ulong)(uVar11 >> 0x1b);
      } while (uVar9 < uVar20);
    }
    if (uVar15 != uVar22) {
      __assert_fail("k == nSuppSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x7e,"int Mpm_CutTruthMinimize7(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    uVar7 = 0;
    if (0x7ffffff < uVar11) {
      uVar21 = (ulong)(uint)(1 << ((char)uVar20 - 6U & 0x1f));
      uVar9 = 0;
      uVar7 = 0;
LAB_003f8f61:
      bVar4 = (byte)uVar9;
      if (uVar11 < 0x38000000) {
        uVar12 = (uint)((s_Truths6Neg[uVar9] &
                        (*pwVar16 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *pwVar16)) != 0);
      }
      else if (uVar9 < 6) {
        uVar17 = 0;
        do {
          if (((pwVar16[uVar17] >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ pwVar16[uVar17]) &
              s_Truths6Neg[uVar9]) != 0) goto LAB_003f9002;
          uVar17 = uVar17 + 1;
        } while (uVar21 != uVar17);
        uVar12 = 0;
      }
      else {
        uVar17 = (ulong)(uint)(1 << (bVar4 - 6 & 0x1f));
        uVar15 = 2 << (bVar4 - 6 & 0x1f);
        pwVar6 = pwVar16 + uVar17;
        pwVar18 = pwVar16;
        do {
          uVar19 = 0;
          do {
            if (pwVar18[uVar19] != pwVar6[uVar19]) goto LAB_003f9002;
            uVar19 = uVar19 + 1;
          } while (uVar17 != uVar19);
          pwVar18 = pwVar18 + uVar15;
          pwVar6 = pwVar6 + uVar15;
          uVar12 = 0;
        } while (pwVar18 < pwVar16 + uVar21);
      }
      goto LAB_003f9007;
    }
LAB_003f9016:
    if (uVar22 != uVar7) {
      __assert_fail("nSuppSize == Abc_TtSupportSize(p->Truth, Mpm_CutLeafNum(pCut))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0x7f,"int Mpm_CutTruthMinimize7(Mpm_Man_t *, Mpm_Cut_t *)");
    }
    *(uint *)&pCut->field_0x4 = uVar11 & 0x7ffffff | uVar22 << 0x1b;
    uVar11 = Vec_MemHashInsert(p->vTtMem,pwVar16);
    if ((int)uVar11 < 0) goto LAB_003f90b0;
    *(uint *)&pCut->field_0x4 = (*(uint *)&pCut->field_0x4 & 0xfe000001) + (uVar11 & 0xffffff) * 2;
  }
  return 1;
LAB_003f9002:
  uVar12 = 1;
LAB_003f9007:
  uVar7 = uVar7 + uVar12;
  uVar9 = uVar9 + 1;
  if (uVar9 == uVar20) goto LAB_003f9016;
  goto LAB_003f8f61;
}

Assistant:

int Mpm_CutComputeTruth( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int RetValue;
    if ( p->nLutSize <= 6 )
        RetValue = Mpm_CutComputeTruth6( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
    else
        RetValue = Mpm_CutComputeTruth7( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
#ifdef MPM_TRY_NEW
    {
        extern unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm );
        char pCanonPerm[16];
        memcpy( p->Truth0, p->Truth, sizeof(word) * p->nTruWords );
        Abc_TtCanonicize( p->Truth0, pCut->nLimit, pCanonPerm );
    }
#endif
    return RetValue;
}